

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  bool bVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  byte bVar5;
  uint a;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  float *output;
  stbi_uc *psVar10;
  ulong uVar11;
  long lVar12;
  stbi_uc *input;
  int b;
  uint uVar13;
  float *output_00;
  int c;
  int iVar14;
  ulong uVar15;
  long *in_FS_OFFSET;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  float *local_638;
  stbi_uc *local_630;
  long local_628;
  char *local_5f8;
  stbi_uc local_5f0;
  stbi_uc local_5ef;
  stbi_uc local_5ee;
  stbi_uc local_5ed;
  stbi_uc local_5ec [4];
  stbi_uc *local_5e8;
  undefined8 uStack_5e0;
  undefined4 local_5d8;
  char *local_5d0;
  char *pcStack_5c8;
  undefined8 local_5c0;
  stbi_uc *local_5b8;
  undefined8 uStack_5b0;
  undefined4 local_5a8;
  char *local_5a0;
  char *pcStack_598;
  undefined8 local_590;
  float *local_588;
  undefined8 uStack_580;
  undefined4 local_578;
  char *local_570;
  char *pcStack_568;
  undefined8 local_560;
  stbi_uc *local_558;
  undefined8 uStack_550;
  undefined4 local_548;
  char *local_540;
  char *pcStack_538;
  undefined8 local_530;
  float *local_528;
  undefined8 uStack_520;
  undefined4 local_518;
  char *local_510;
  char *pcStack_508;
  undefined8 local_500;
  float *local_4f8;
  undefined8 uStack_4f0;
  undefined4 local_4e8;
  char *local_4e0;
  char *pcStack_4d8;
  undefined8 local_4d0;
  stbi_uc *local_4c8;
  undefined8 uStack_4c0;
  undefined4 local_4b8;
  char *local_4b0;
  char *pcStack_4a8;
  undefined8 local_4a0;
  float *local_498;
  undefined8 uStack_490;
  undefined4 local_488;
  char *local_480;
  char *pcStack_478;
  undefined8 local_470;
  stbi_uc *local_468;
  undefined8 uStack_460;
  undefined4 local_458;
  char *local_450;
  char *pcStack_448;
  undefined8 local_440;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  iVar14 = req_comp;
  stbi__hdr_gettoken(s,&local_438);
  if ((CONCAT17(cStack_42e,
                CONCAT16(cStack_42f,
                         CONCAT15(cStack_430,
                                  CONCAT14(cStack_431,
                                           CONCAT13(cStack_432,
                                                    CONCAT12(cStack_433,
                                                             CONCAT11(cStack_434,cStack_435)))))))
       == 0x45434e41494441 &&
       CONCAT17(cStack_431,
                CONCAT16(cStack_432,
                         CONCAT15(cStack_433,
                                  CONCAT14(cStack_434,
                                           CONCAT13(cStack_435,
                                                    CONCAT12(cStack_436,
                                                             CONCAT11(cStack_437,local_438))))))) ==
       0x4e41494441523f23) ||
     (CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) == 0x454247 &&
      CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) == 0x47523f23)) {
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar1 = false;
      do {
        auVar16[0] = -(cStack_431 == '3');
        auVar16[1] = -(cStack_430 == '2');
        auVar16[2] = -(cStack_42f == '-');
        auVar16[3] = -(cStack_42e == 'b');
        auVar16[4] = -(cStack_42d == 'i');
        auVar16[5] = -(cStack_42c == 't');
        auVar16[6] = -(cStack_42b == '_');
        auVar16[7] = -(cStack_42a == 'r');
        auVar16[8] = -(cStack_429 == 'l');
        auVar16[9] = -(cStack_428 == 'e');
        auVar16[10] = -(cStack_427 == '_');
        auVar16[0xb] = -(cStack_426 == 'r');
        auVar16[0xc] = -(cStack_425 == 'g');
        auVar16[0xd] = -(cStack_424 == 'b');
        auVar16[0xe] = -(cStack_423 == 'e');
        auVar16[0xf] = -(cStack_422 == '\0');
        auVar17[0] = -(local_438 == 'F');
        auVar17[1] = -(cStack_437 == 'O');
        auVar17[2] = -(cStack_436 == 'R');
        auVar17[3] = -(cStack_435 == 'M');
        auVar17[4] = -(cStack_434 == 'A');
        auVar17[5] = -(cStack_433 == 'T');
        auVar17[6] = -(cStack_432 == '=');
        auVar17[7] = -(cStack_431 == '3');
        auVar17[8] = -(cStack_430 == '2');
        auVar17[9] = -(cStack_42f == '-');
        auVar17[10] = -(cStack_42e == 'b');
        auVar17[0xb] = -(cStack_42d == 'i');
        auVar17[0xc] = -(cStack_42c == 't');
        auVar17[0xd] = -(cStack_42b == '_');
        auVar17[0xe] = -(cStack_42a == 'r');
        auVar17[0xf] = -(cStack_429 == 'l');
        auVar17 = auVar17 & auVar16;
        if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) {
          bVar1 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
      } while (local_438 != '\0');
      if (bVar1) {
        stbi__hdr_gettoken(s,&local_438);
        if (cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d) {
          local_5f8 = &cStack_435;
          uVar8 = strtol(local_5f8,&local_5f8,10);
          local_5f8 = local_5f8 + 2;
          do {
            pcVar7 = local_5f8;
            local_5f8 = pcVar7 + 1;
          } while (pcVar7[-2] == ' ');
          if (((pcVar7[-2] == '+') && (pcVar7[-1] == 'X')) && (*pcVar7 == ' ')) {
            uVar9 = strtol(local_5f8,(char **)0x0,10);
            b = (int)uVar8;
            if ((b < 0x1000001) && (a = (uint)uVar9, (int)a < 0x1000001)) {
              *x = a;
              *y = b;
              if (comp != (int *)0x0) {
                *comp = 3;
              }
              c = 3;
              if (req_comp != 0) {
                c = req_comp;
              }
              iVar6 = stbi__mad4sizes_valid(a,b,c,(int)x,iVar14);
              if (iVar6 != 0) {
                output = (float *)stbi__malloc_mad4(a,b,c,(int)x,iVar14);
                if (output != (float *)0x0) {
                  iVar14 = 0;
                  if (a - 0x8000 < 0xffff8008) goto LAB_0015ef79;
                  if (b < 1) {
                    return output;
                  }
                  uVar11 = 0;
                  psVar10 = (stbi_uc *)0x0;
                  local_638 = output;
                  do {
                    sVar2 = stbi__get8(s);
                    sVar3 = stbi__get8(s);
                    sVar4 = stbi__get8(s);
                    if (((sVar2 != '\x02') || (sVar3 != '\x02')) || ((char)sVar4 < '\0')) {
                      local_5f0 = sVar2;
                      local_5ef = sVar3;
                      local_5ee = sVar4;
                      local_5ed = stbi__get8(s);
                      stbi__hdr_convert(output,&local_5f0,c);
                      local_450 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                      ;
                      pcStack_448 = "stbi__hdr_load";
                      local_440 = 0x2aed;
                      uStack_460 = 0;
                      local_458 = 0;
                      local_468 = psVar10;
                      (*(code *)in_FS_OFFSET[-0x85])(*in_FS_OFFSET + -0x430,3);
                      iVar14 = 0;
                      iVar6 = 1;
                      do {
                        stbi__getn(s,local_5ec,4);
                        stbi__hdr_convert(output + (long)(int)(c * a * iVar14) + (long)(iVar6 * c),
                                          local_5ec,c);
                        iVar6 = iVar6 + 1;
                        while ((int)a <= iVar6) {
                          iVar14 = iVar14 + 1;
LAB_0015ef79:
                          iVar6 = 0;
                          if (b <= iVar14) {
                            return output;
                          }
                        }
                      } while( true );
                    }
                    sVar2 = stbi__get8(s);
                    if (CONCAT11(sVar4,sVar2) != a) {
                      lVar12 = *in_FS_OFFSET;
                      local_480 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                      ;
                      pcStack_478 = "stbi__hdr_load";
                      local_470 = 0x2af2;
                      uStack_490 = 0;
                      local_488 = 0;
                      local_498 = output;
                      (*(code *)in_FS_OFFSET[-0x85])(lVar12 + -0x430,3);
                      local_4b0 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                      ;
                      pcStack_4a8 = "stbi__hdr_load";
                      local_4a0 = 0x2af2;
                      uStack_4c0 = 0;
                      local_4b8 = 0;
                      local_4c8 = psVar10;
                      (*(code *)in_FS_OFFSET[-0x85])(lVar12 + -0x430,3);
                      pcVar7 = "invalid decoded scanline length";
LAB_0015eccb:
                      in_FS_OFFSET[-0x81] = (long)pcVar7;
                      return (float *)0x0;
                    }
                    if ((psVar10 == (stbi_uc *)0x0) &&
                       (psVar10 = (stbi_uc *)stbi__malloc_mad2(a,4,0), psVar10 == (stbi_uc *)0x0)) {
                      local_4e0 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                      ;
                      pcStack_4d8 = "stbi__hdr_load";
                      local_4d0 = 0x2af6;
                      uStack_4f0 = 0;
                      local_4e8 = 0;
                      local_4f8 = output;
                      (*(code *)in_FS_OFFSET[-0x85])(*in_FS_OFFSET + -0x430,3);
                      break;
                    }
                    local_628 = 0;
                    local_630 = psVar10;
                    do {
                      iVar14 = 0;
                      uVar15 = uVar9 & 0xffffffff;
                      do {
                        bVar5 = stbi__get8(s);
                        if (bVar5 < 0x81) {
                          uVar13 = (uint)bVar5;
                          if ((uint)uVar15 < uVar13) {
                            lVar12 = *in_FS_OFFSET + -0x430;
                            local_570 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                            ;
                            pcStack_568 = "stbi__hdr_load";
                            local_560 = 0x2b09;
                            uStack_580 = 0;
                            local_578 = 0;
                            local_588 = output;
                            (*(code *)in_FS_OFFSET[-0x85])(lVar12,3);
                            local_5a0 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                            ;
                            pcStack_598 = "stbi__hdr_load";
                            local_590 = 0x2b09;
                            uStack_5b0 = 0;
                            local_5a8 = 0;
                            local_5b8 = psVar10;
                            goto LAB_0015ecaf;
                          }
                          if (uVar13 != 0) {
                            lVar12 = 0;
                            do {
                              sVar2 = stbi__get8(s);
                              local_630[lVar12 * 4 + (long)iVar14 * 4] = sVar2;
                              lVar12 = lVar12 + 1;
                            } while (uVar13 != (uint)lVar12);
                            iVar14 = iVar14 + (uint)lVar12;
                          }
                        }
                        else {
                          sVar2 = stbi__get8(s);
                          if ((uint)uVar15 < (bVar5 & 0x7f)) {
                            lVar12 = *in_FS_OFFSET + -0x430;
                            local_510 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                            ;
                            pcStack_508 = "stbi__hdr_load";
                            local_500 = 0x2b04;
                            uStack_520 = 0;
                            local_518 = 0;
                            local_528 = output;
                            (*(code *)in_FS_OFFSET[-0x85])(lVar12,3);
                            local_540 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                            ;
                            pcStack_538 = "stbi__hdr_load";
                            local_530 = 0x2b04;
                            uStack_550 = 0;
                            local_548 = 0;
                            local_558 = psVar10;
LAB_0015ecaf:
                            (*(code *)in_FS_OFFSET[-0x85])(lVar12,3);
                            pcVar7 = "corrupt";
                            goto LAB_0015eccb;
                          }
                          if ((bVar5 & 0x7f) != 0) {
                            lVar12 = 0;
                            do {
                              local_630[lVar12 * 4 + (long)iVar14 * 4] = sVar2;
                              lVar12 = lVar12 + 1;
                            } while ((bVar5 & 0x7f) != (uint)lVar12);
                            iVar14 = iVar14 + (uint)lVar12;
                          }
                        }
                        uVar15 = (ulong)(a - iVar14);
                      } while (a - iVar14 != 0 && iVar14 <= (int)a);
                      local_628 = local_628 + 1;
                      local_630 = local_630 + 1;
                      input = psVar10;
                      output_00 = local_638;
                      uVar15 = uVar9 & 0x7fffffff;
                    } while (local_628 != 4);
                    do {
                      stbi__hdr_convert(output_00,input,c);
                      uVar15 = uVar15 - 1;
                      input = input + 4;
                      output_00 = output_00 + c;
                    } while (uVar15 != 0);
                    uVar11 = uVar11 + 1;
                    local_638 = local_638 + (uVar9 & 0xffffffff) * (long)c;
                    if (uVar11 == (uVar8 & 0x7fffffff)) {
                      local_5d0 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                      ;
                      pcStack_5c8 = "stbi__hdr_load";
                      local_5c0 = 0x2b13;
                      uStack_5e0 = 0;
                      local_5d8 = 0;
                      local_5e8 = psVar10;
                      (*(code *)in_FS_OFFSET[-0x85])(*in_FS_OFFSET + -0x430,3);
                      return output;
                    }
                  } while( true );
                }
                pcVar7 = "outofmem";
                goto LAB_0015ea8a;
              }
            }
            pcVar7 = "too large";
            goto LAB_0015ea8a;
          }
        }
        pcVar7 = "unsupported data layout";
        goto LAB_0015ea8a;
      }
    }
    pcVar7 = "unsupported format";
  }
  else {
    pcVar7 = "not HDR";
  }
LAB_0015ea8a:
  in_FS_OFFSET[-0x81] = (long)pcVar7;
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   if (height > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");
   if (width > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}